

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O0

void __thiscall
kratos::UnusedTopBlockVisitor::visit(UnusedTopBlockVisitor *this,Generator *generator)

{
  bool bVar1;
  StatementType SVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  element_type *this_00;
  element_type *peVar4;
  reference stmt_00;
  StmtBlock *local_c0;
  shared_ptr<kratos::Stmt> *stmt_1;
  iterator __end2;
  iterator __begin2;
  set<std::shared_ptr<kratos::Stmt>,_std::less<std::shared_ptr<kratos::Stmt>_>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  *__range2;
  StmtBlock *block;
  shared_ptr<kratos::Stmt> stmt;
  uint64_t i;
  uint64_t stmt_count;
  set<std::shared_ptr<kratos::Stmt>,_std::less<std::shared_ptr<kratos::Stmt>_>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  blocks_to_remove;
  Generator *generator_local;
  UnusedTopBlockVisitor *this_local;
  
  blocks_to_remove._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)generator;
  memset(&stmt_count,0,0x30);
  std::
  set<std::shared_ptr<kratos::Stmt>,_std::less<std::shared_ptr<kratos::Stmt>_>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  ::set((set<std::shared_ptr<kratos::Stmt>,_std::less<std::shared_ptr<kratos::Stmt>_>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
         *)&stmt_count);
  p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           Generator::stmts_count
                     ((Generator *)blocks_to_remove._M_t._M_impl.super__Rb_tree_header._M_node_count
                     );
  for (stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi < p_Var3;
      stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((long)&(stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi)->_vptr__Sp_counted_base + 1)) {
    Generator::get_stmt((Generator *)&block,
                        (uint32_t)blocks_to_remove._M_t._M_impl.super__Rb_tree_header._M_node_count)
    ;
    this_00 = std::__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&block);
    SVar2 = Stmt::type(this_00);
    if (SVar2 == Block) {
      peVar4 = std::__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>::get
                         ((__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *)&block);
      if (peVar4 == (element_type *)0x0) {
        local_c0 = (StmtBlock *)0x0;
      }
      else {
        local_c0 = (StmtBlock *)__dynamic_cast(peVar4,&Stmt::typeinfo,&StmtBlock::typeinfo,0);
      }
      bVar1 = StmtBlock::empty(local_c0);
      if (bVar1) {
        std::
        set<std::shared_ptr<kratos::Stmt>,std::less<std::shared_ptr<kratos::Stmt>>,std::allocator<std::shared_ptr<kratos::Stmt>>>
        ::emplace<std::shared_ptr<kratos::Stmt>&>
                  ((set<std::shared_ptr<kratos::Stmt>,std::less<std::shared_ptr<kratos::Stmt>>,std::allocator<std::shared_ptr<kratos::Stmt>>>
                    *)&stmt_count,(shared_ptr<kratos::Stmt> *)&block);
      }
    }
    std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)&block);
  }
  __end2 = std::
           set<std::shared_ptr<kratos::Stmt>,_std::less<std::shared_ptr<kratos::Stmt>_>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
           ::begin((set<std::shared_ptr<kratos::Stmt>,_std::less<std::shared_ptr<kratos::Stmt>_>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                    *)&stmt_count);
  stmt_1 = (shared_ptr<kratos::Stmt> *)
           std::
           set<std::shared_ptr<kratos::Stmt>,_std::less<std::shared_ptr<kratos::Stmt>_>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
           ::end((set<std::shared_ptr<kratos::Stmt>,_std::less<std::shared_ptr<kratos::Stmt>_>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                  *)&stmt_count);
  while (bVar1 = std::operator!=(&__end2,(_Self *)&stmt_1), bVar1) {
    stmt_00 = std::_Rb_tree_const_iterator<std::shared_ptr<kratos::Stmt>_>::operator*(&__end2);
    Generator::remove_stmt
              ((Generator *)blocks_to_remove._M_t._M_impl.super__Rb_tree_header._M_node_count,
               stmt_00);
    std::_Rb_tree_const_iterator<std::shared_ptr<kratos::Stmt>_>::operator++(&__end2);
  }
  std::
  set<std::shared_ptr<kratos::Stmt>,_std::less<std::shared_ptr<kratos::Stmt>_>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  ::~set((set<std::shared_ptr<kratos::Stmt>,_std::less<std::shared_ptr<kratos::Stmt>_>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
          *)&stmt_count);
  return;
}

Assistant:

void visit(Generator* generator) override {
        std::set<std::shared_ptr<Stmt>> blocks_to_remove = {};
        uint64_t stmt_count = generator->stmts_count();
        for (uint64_t i = 0; i < stmt_count; i++) {
            auto stmt = generator->get_stmt(i);
            if (stmt->type() == StatementType::Block) {
                auto* block = dynamic_cast<StmtBlock*>(stmt.get());
                if (block->empty()) blocks_to_remove.emplace(stmt);
            }
        }

        for (auto const& stmt : blocks_to_remove) {
            generator->remove_stmt(stmt);
        }
    }